

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_KrylovDemo_prec.c
# Opt level: O0

void PrintAllSpecies(N_Vector c,int ns,int mxns,sunrealtype t)

{
  long lVar1;
  int in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  undefined8 in_XMM0_Qa;
  sunrealtype *cdata;
  int jy;
  int jx;
  int i;
  int local_24;
  int local_20;
  uint local_1c;
  
  lVar1 = N_VGetArrayPointer(in_RDI);
  printf("c values at t = %g:\n\n",in_XMM0_Qa);
  for (local_1c = 1; (int)local_1c <= in_ESI; local_1c = local_1c + 1) {
    printf("Species %d\n",(ulong)local_1c);
    for (local_24 = 5; -1 < local_24; local_24 = local_24 + -1) {
      for (local_20 = 0; local_20 < 6; local_20 = local_20 + 1) {
        printf("%-10.6g",
               *(undefined8 *)
                (lVar1 + (long)(int)((local_1c - 1) + local_20 * in_ESI + local_24 * in_EDX) * 8));
      }
      printf("\n");
    }
    printf("\n");
  }
  return;
}

Assistant:

static void PrintAllSpecies(N_Vector c, int ns, int mxns, sunrealtype t)
{
  int i, jx, jy;
  sunrealtype* cdata;

  cdata = N_VGetArrayPointer(c);
#if defined(SUNDIALS_EXTENDED_PRECISION)
  printf("c values at t = %Lg:\n\n", t);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
  printf("c values at t = %g:\n\n", t);
#else
  printf("c values at t = %g:\n\n", t);
#endif
  for (i = 1; i <= ns; i++)
  {
    printf("Species %d\n", i);
    for (jy = MY - 1; jy >= 0; jy--)
    {
      for (jx = 0; jx < MX; jx++)
      {
#if defined(SUNDIALS_EXTENDED_PRECISION)
        printf("%-10.6Lg", cdata[(i - 1) + jx * ns + jy * mxns]);
#elif defined(SUNDIALS_DOUBLE_PRECISION)
        printf("%-10.6g", cdata[(i - 1) + jx * ns + jy * mxns]);
#else
        printf("%-10.6g", cdata[(i - 1) + jx * ns + jy * mxns]);
#endif
      }
      printf("\n");
    }
    printf("\n");
  }
}